

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::emplace<QTimeZone::OffsetData>
          (QMovableArrayOps<QTimeZone::OffsetData> *this,qsizetype i,OffsetData *args)

{
  OffsetData **ppOVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  OffsetData *pOVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  int iVar9;
  OffsetData *__dest;
  QDateTime *this_00;
  long in_FS_OFFSET;
  bool bVar10;
  Data DStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
           super_QArrayDataPointer<QTimeZone::OffsetData>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0035aaf8:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    DStack_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar7 = (args->abbreviation).d.d;
    pcVar8 = (args->abbreviation).d.ptr;
    (args->abbreviation).d.d = (Data *)0x0;
    (args->abbreviation).d.ptr = (char16_t *)0x0;
    qVar5 = (args->abbreviation).d.size;
    (args->abbreviation).d.size = 0;
    QDateTime::QDateTime((QDateTime *)&DStack_50.data,&args->atUtc);
    puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,args->daylightTimeOffset);
    local_48._0_4_ = args->offsetFromUtc;
    local_48._4_4_ = args->standardTimeOffset;
    bVar10 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
             super_QArrayDataPointer<QTimeZone::OffsetData>.size != 0;
    QArrayDataPointer<QTimeZone::OffsetData>::detachAndGrow
              ((QArrayDataPointer<QTimeZone::OffsetData> *)this,(uint)(i == 0 && bVar10),1,
               (OffsetData **)0x0,(QArrayDataPointer<QTimeZone::OffsetData> *)0x0);
    pOVar6 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
             super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
    if (i == 0 && bVar10) {
      pOVar6[-1].abbreviation.d.d = pDVar7;
      pOVar6[-1].abbreviation.d.ptr = pcVar8;
      pOVar6[-1].abbreviation.d.size = qVar5;
      QDateTime::QDateTime(&pOVar6[-1].atUtc,(QDateTime *)&DStack_50.data);
      pOVar6[-1].daylightTimeOffset = (int)puStack_40;
      *(undefined1 **)&pOVar6[-1].offsetFromUtc = local_48;
      ppOVar1 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
      *ppOVar1 = *ppOVar1 + -1;
    }
    else {
      __dest = pOVar6 + i + 1;
      memmove(__dest,pOVar6 + i,
              ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
               super_QArrayDataPointer<QTimeZone::OffsetData>.size - i) * 0x30);
      __dest[-1].abbreviation.d.d = pDVar7;
      __dest[-1].abbreviation.d.ptr = pcVar8;
      __dest[-1].abbreviation.d.size = qVar5;
      this_00 = &pOVar6[i].atUtc;
      QDateTime::QDateTime(this_00,(QDateTime *)&DStack_50.data);
      *(int *)(this_00 + 2) = (int)puStack_40;
      this_00[1] = (QDateTime)local_48;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
              super_QArrayDataPointer<QTimeZone::OffsetData>.size;
    *pqVar2 = *pqVar2 + 1;
    QDateTime::~QDateTime((QDateTime *)&DStack_50.data);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
            super_QArrayDataPointer<QTimeZone::OffsetData>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                      super_QArrayDataPointer<QTimeZone::OffsetData>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pOVar6 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
               super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
      pDVar7 = (args->abbreviation).d.d;
      (args->abbreviation).d.d = (Data *)0x0;
      pOVar6 = pOVar6 + lVar4;
      (pOVar6->abbreviation).d.d = pDVar7;
      pcVar8 = (args->abbreviation).d.ptr;
      (args->abbreviation).d.ptr = (char16_t *)0x0;
      (pOVar6->abbreviation).d.ptr = pcVar8;
      qVar5 = (args->abbreviation).d.size;
      (args->abbreviation).d.size = 0;
      (pOVar6->abbreviation).d.size = qVar5;
      QDateTime::QDateTime(&pOVar6->atUtc,&args->atUtc);
      pOVar6->daylightTimeOffset = args->daylightTimeOffset;
      iVar9 = args->standardTimeOffset;
      pOVar6->offsetFromUtc = args->offsetFromUtc;
      pOVar6->standardTimeOffset = iVar9;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((OffsetData *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
             super_QArrayDataPointer<QTimeZone::OffsetData>.ptr)) goto LAB_0035aaf8;
      pOVar6 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
               super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
      pDVar7 = (args->abbreviation).d.d;
      (args->abbreviation).d.d = (Data *)0x0;
      pOVar6[-1].abbreviation.d.d = pDVar7;
      pcVar8 = (args->abbreviation).d.ptr;
      (args->abbreviation).d.ptr = (char16_t *)0x0;
      pOVar6[-1].abbreviation.d.ptr = pcVar8;
      qVar5 = (args->abbreviation).d.size;
      (args->abbreviation).d.size = 0;
      pOVar6[-1].abbreviation.d.size = qVar5;
      QDateTime::QDateTime(&pOVar6[-1].atUtc,&args->atUtc);
      pOVar6[-1].daylightTimeOffset = args->daylightTimeOffset;
      iVar9 = args->standardTimeOffset;
      pOVar6[-1].offsetFromUtc = args->offsetFromUtc;
      pOVar6[-1].standardTimeOffset = iVar9;
      ppOVar1 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
      *ppOVar1 = *ppOVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
              super_QArrayDataPointer<QTimeZone::OffsetData>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }